

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O0

bool __thiscall iDynTree::DiscreteKalmanFilterHelper::kfInit(DiscreteKalmanFilterHelper *this)

{
  long in_RDI;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x1d9) & 1) == 0) {
    iDynTree::reportError
              ("DiscreteKalmanFilterHelper","kfInit","Please construct the filter first.");
    local_1 = false;
  }
  else if (((*(byte *)(in_RDI + 0x1dc) & 1) == 0) || ((*(byte *)(in_RDI + 0x1dd) & 1) == 0)) {
    iDynTree::reportError
              ("DiscreteKalmanFilterHelper","kfInit",
               "Please set the noise covariance matrices Q and R.");
    local_1 = false;
  }
  else if (((*(byte *)(in_RDI + 0x1da) & 1) == 0) || ((*(byte *)(in_RDI + 0x1db) & 1) == 0)) {
    iDynTree::reportError
              ("DiscreteKalmanFilterHelper","kfInit",
               "Please set the initial state and the state covariance matrix.");
    local_1 = false;
  }
  else {
    *(undefined1 *)(in_RDI + 0x1d8) = 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfInit()
{
    if (!m_filter_constructed)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfInit", "Please construct the filter first.");
        return false;
    }

    if (!m_measurement_noise_covariance_matrix_set || !m_system_noise_covariance_matrix_set)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfInit", "Please set the noise covariance matrices Q and R.");
        return false;
    }

    if (!m_initial_state_set || !m_initial_state_covariance_set)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfInit", "Please set the initial state and the state covariance matrix.");
        return false;
    }

    m_is_initialized = true;
    return true;
}